

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::SetElementIOnTaggedNumber
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  int iVar4;
  undefined4 *puVar5;
  Var indexVar;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  RecyclableObject *local_48;
  Var local_40;
  uint32 local_38;
  PropertyOperationFlags local_34;
  uint32 indexVal;
  
  propertyRecord = (PropertyRecord *)index;
  local_48 = object;
  bVar2 = VarIs<Js::RecyclableObject>(receiver);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xff5,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  local_38 = 0;
  local_58 = (PropertyRecord *)0x0;
  local_40 = value;
  local_34 = propertyOperationFlags;
  indexVar = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(propertyRecord,requestContext)
  ;
  IVar3 = GetIndexTypeFromPrimitive
                    (indexVar,requestContext,&local_38,&local_58,(JavascriptString **)0x0,true,false
                    );
  if (IVar3 == IndexType_Number) {
    iVar4 = SetItemOnTaggedNumber(receiver,local_48,local_38,local_40,requestContext,local_34);
  }
  else {
    iVar4 = SetPropertyOnTaggedNumber
                      (receiver,local_48,local_58->pid,local_40,requestContext,local_34);
  }
  return iVar4 != 0;
}

Assistant:

bool JavascriptOperators::SetElementIOnTaggedNumber(
        _In_ Var receiver,
        _In_ RecyclableObject* object,
        _In_ Var index,
        _In_ Var value,
        _In_ ScriptContext* requestContext,
        _In_ PropertyOperationFlags propertyOperationFlags)
    {
        Assert(TaggedNumber::Is(receiver));

        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexType(index, requestContext, &indexVal, &propertyRecord, true);
        if (indexType == IndexType_Number)
        {
            return  JavascriptOperators::SetItemOnTaggedNumber(receiver, object, indexVal, value, requestContext, propertyOperationFlags);
        }
        else
        {
            return  JavascriptOperators::SetPropertyOnTaggedNumber(receiver, object, propertyRecord->GetPropertyId(), value, requestContext, propertyOperationFlags);
        }
    }